

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O1

void google::protobuf::internal::MapMergeFrom<int,proto2_unittest::ForeignMessage>
               (Map<int,_proto2_unittest::ForeignMessage> *dest,
               Map<int,_proto2_unittest::ForeignMessage> *src)

{
  NodeBase *pNVar1;
  uint uVar2;
  ulong uVar3;
  pair<google::protobuf::Map<int,_proto2_unittest::ForeignMessage>::iterator,_bool> local_50;
  
  uVar2 = (src->super_KeyMapBase<unsigned_int>).super_UntypedMapBase.index_of_first_non_null_;
  uVar3 = (ulong)uVar2;
  if (uVar2 == (src->super_KeyMapBase<unsigned_int>).super_UntypedMapBase.num_buckets_) {
    uVar3 = 0;
    pNVar1 = (NodeBase *)0x0;
  }
  else {
    pNVar1 = (src->super_KeyMapBase<unsigned_int>).super_UntypedMapBase.table_[uVar3];
    if (pNVar1 == (NodeBase *)0x0) {
      protobuf_assumption_failed
                ("node != nullptr",
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map.h"
                 ,0x22e);
    }
  }
  if (pNVar1 != (NodeBase *)0x0) {
    do {
      Map<int,proto2_unittest::ForeignMessage>::TryEmplaceInternal<int_const&>
                (&local_50,dest,(int *)(pNVar1 + 1));
      proto2_unittest::ForeignMessage::CopyFrom
                ((ForeignMessage *)(local_50.first.super_UntypedMapIterator.node_ + 2),
                 (ForeignMessage *)(pNVar1 + 2));
      pNVar1 = pNVar1->next;
      if (pNVar1 == (NodeBase *)0x0) {
        do {
          uVar2 = (int)uVar3 + 1;
          uVar3 = (ulong)uVar2;
          if ((src->super_KeyMapBase<unsigned_int>).super_UntypedMapBase.num_buckets_ <= uVar2) {
            pNVar1 = (NodeBase *)0x0;
            uVar3 = 0;
            break;
          }
          pNVar1 = (src->super_KeyMapBase<unsigned_int>).super_UntypedMapBase.table_[uVar2];
        } while (pNVar1 == (NodeBase *)0x0);
      }
    } while (pNVar1 != (NodeBase *)0x0);
  }
  return;
}

Assistant:

PROTOBUF_NOINLINE void MapMergeFrom(Map<T...>& dest, const Map<T...>& src) {
  for (const auto& elem : src) {
    dest[elem.first] = elem.second;
  }
}